

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
kj::
ArrayBuilder<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_>::Entry>
::truncate(ArrayBuilder<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_>::Entry>
           *this,char *__file,__off_t __length)

{
  Entry *pEVar1;
  Entry *pEVar2;
  AnnotatedHandler *pAVar3;
  Disposer *pDVar4;
  
  pEVar1 = this->ptr;
  pEVar2 = this->pos;
  while (pEVar1 + (long)__file < pEVar2) {
    this->pos = pEVar2 + -1;
    pAVar3 = pEVar2[-1].value.ptr.ptr;
    if (pAVar3 != (AnnotatedHandler *)0x0) {
      pEVar2[-1].value.ptr.ptr = (AnnotatedHandler *)0x0;
      pDVar4 = pEVar2[-1].value.ptr.disposer;
      (**pDVar4->_vptr_Disposer)
                (pDVar4,(pAVar3->super_Handler<capnp::DynamicStruct,_(capnp::Style)2>).
                        super_HandlerBase._vptr_HandlerBase[-2] +
                        (long)&(pAVar3->super_Handler<capnp::DynamicStruct,_(capnp::Style)2>).
                               super_HandlerBase._vptr_HandlerBase);
    }
    pEVar2 = this->pos;
  }
  return (int)pEVar2;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }